

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

l2_expr_info *
l2_eval_expr_bit_xor1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  l2_expr_info lVar1;
  undefined8 uVar2;
  boolean bVar3;
  l2_scope *local_60;
  _val_union local_58;
  l2_token *local_48;
  l2_token *current_token_p;
  l2_expr_info new_left_expr_info;
  l2_expr_info right_expr_info;
  l2_scope *scope_p_local;
  
  lVar1 = left_expr_info;
  bVar3 = l2_parse_probe_next_token_by_type(L2_TOKEN_BIT_XOR);
  if (bVar3 == '\0') {
    __return_storage_ptr__->val_type = left_expr_info.val_type;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = left_expr_info._4_4_;
    (__return_storage_ptr__->val).real = left_expr_info.val.real;
    left_expr_info.val.procedure.upper_scope_p = lVar1.val._8_8_;
    (__return_storage_ptr__->val).procedure.upper_scope_p =
         left_expr_info.val.procedure.upper_scope_p;
  }
  else {
    l2_parse_token_forward();
    local_48 = l2_parse_token_current();
    l2_eval_expr_bit_and((l2_expr_info *)&local_60,scope_p);
    new_left_expr_info.val.procedure.upper_scope_p = local_60;
    uVar2 = new_left_expr_info.val.procedure.upper_scope_p;
    if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
      l2_parsing_error(L2_PARSING_ERROR_LEFT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE,
                       local_48->current_line,local_48->current_col,"^");
    }
    new_left_expr_info.val._8_4_ = SUB84(local_60,0);
    new_left_expr_info.val.procedure.upper_scope_p = (l2_scope *)uVar2;
    if (new_left_expr_info.val._8_4_ != 2) {
      l2_parsing_error(L2_PARSING_ERROR_RIGHT_SIDE_OF_OPERATOR_MUST_BE_A_BOOL_VALUE,
                       local_48->current_line,local_48->current_col,"^");
    }
    current_token_p._0_4_ = 2;
    new_left_expr_info._0_8_ = left_expr_info.val.integer ^ local_58.integer;
    lVar1._4_4_ = current_token_p._4_4_;
    lVar1.val_type = 2;
    lVar1.val.integer = new_left_expr_info._0_8_;
    lVar1.val._8_8_ = new_left_expr_info.val.real;
    l2_eval_expr_bit_xor1(__return_storage_ptr__,scope_p,lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_bit_xor1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p
    _if_type (L2_TOKEN_BIT_XOR)
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_bit_and(scope_p);
        _if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
            _if (right_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
                new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                new_left_expr_info.val.integer = (left_expr_info.val.integer ^ right_expr_info.val.integer);
                return l2_eval_expr_bit_xor1(scope_p, new_left_expr_info);

            } _throw_right_expr_not_bool("^")

        } _throw_left_expr_not_bool("^")

    }
    _else
    {
        return left_expr_info;
    }
}